

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O1

string * __thiscall
t_st_generator::struct_reader
          (string *__return_storage_ptr__,t_st_generator *this,t_struct *tstruct,string *clsName)

{
  int *piVar1;
  pointer pcVar2;
  string *psVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer pptVar8;
  string desc;
  string val;
  string name;
  string found;
  ostringstream out;
  string local_338;
  string local_318;
  t_struct *local_2f8;
  string local_2f0;
  string local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  string local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  string local_250;
  string local_230;
  string *local_210;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  local_2f8 = tstruct;
  local_210 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  temp_name_abi_cxx11_(&local_290,this);
  temp_name_abi_cxx11_(&local_2f0,this);
  temp_name_abi_cxx11_(&local_230,this);
  if (clsName->_M_string_length == 0) {
    (*(local_2f8->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::_M_assign((string *)clsName);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[|",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pcVar2 = (clsName->_M_dataplus)._M_p;
  local_2b0 = &local_2a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar2,pcVar2 + clsName->_M_string_length);
  paVar7 = local_2b0;
  iVar4 = toupper((int)local_2b0->_M_local_buf[0]);
  paVar7->_M_local_buf[0] = (char)iVar4;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  if (local_2b0 == &local_2a0) {
    local_338.field_2._8_8_ = local_2a0._8_8_;
  }
  else {
    local_338._M_dataplus._M_p = (pointer)local_2b0;
  }
  local_338._M_string_length = local_2a8;
  local_2a8 = 0;
  local_2a0._M_local_buf[0] = '\0';
  local_2b0 = &local_2a0;
  iVar4 = std::__cxx11::string::compare((char *)&local_338);
  if (iVar4 == 0) {
    pcVar2 = (clsName->_M_dataplus)._M_p;
    local_270 = &local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,pcVar2,pcVar2 + clsName->_M_string_length);
    paVar7 = local_270;
    iVar5 = toupper((int)local_270->_M_local_buf[0]);
    paVar7->_M_local_buf[0] = (char)iVar5;
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    if (local_270 == &local_260) {
      local_250.field_2._8_8_ = local_260._8_8_;
    }
    else {
      local_250._M_dataplus._M_p = (pointer)local_270;
    }
    local_250._M_string_length = local_268;
    local_270 = &local_260;
    local_268 = 0;
    local_260._M_local_buf[0] = '\0';
  }
  else {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    pcVar2 = (clsName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar2,pcVar2 + clsName->_M_string_length);
    prefix(&local_250,this,&local_1c8);
  }
  if (iVar4 == 0) {
    paVar7 = &local_260;
  }
  else {
    paVar7 = &local_1c8.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar7->_M_local_buf + -0x10) != paVar7) {
    operator_delete(*(undefined1 **)(paVar7->_M_local_buf + -0x10));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_338._M_dataplus._M_p,local_338._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," := ",4);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," new.",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_338._M_dataplus._M_p,local_338._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot readStructBegin.",0x16);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_318,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_318._M_dataplus._M_p,local_318._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," := iprot readFieldBegin.",0x19);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," type = TType stop] whileFalse: [|",0x22);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar8 = (local_2f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar8 !=
      (local_2f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_338._M_dataplus._M_p,local_338._M_string_length
                         );
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," id = ",6);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(*pptVar8)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ifTrue: [",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_338._M_dataplus._M_p,local_338._M_string_length
                         );
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," := true.",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_318,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_318._M_dataplus._M_p,local_318._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      pcVar2 = ((*pptVar8)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,pcVar2,pcVar2 + ((*pptVar8)->name_)._M_string_length);
      t_generator::camelcase(&local_2d0,(t_generator *)this,&local_1e8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      read_val_abi_cxx11_(&local_208,this,(*pptVar8)->type_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,local_208._M_dataplus._M_p,local_208._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"].",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             (local_2f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_338._M_dataplus._M_p,local_338._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ifNil: [iprot skip: ",0x15);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," type]].",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_338._M_dataplus._M_p,local_338._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot readStructEnd.",0x14);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_318,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_318._M_dataplus._M_p,local_318._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] value",7);
  psVar3 = local_210;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

string t_st_generator::struct_reader(t_struct* tstruct, string clsName = "") {
  std::ostringstream out;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator fld_iter;
  string val = temp_name();
  string desc = temp_name();
  string found = temp_name();

  if (clsName.size() == 0) {
    clsName = tstruct->get_name();
  }

  out << "[|" << desc << " " << val << "|" << endl;
  indent_up();

  // This is nasty, but without it we'll break things by prefixing TResult.
  string name = ((capitalize(clsName) == "TResult") ? capitalize(clsName) : prefix(clsName));
  out << indent() << val << " := " << name << " new." << endl;

  out << indent() << "iprot readStructBegin." << endl << indent() << "[" << desc
      << " := iprot readFieldBegin." << endl << indent() << desc
      << " type = TType stop] whileFalse: [|" << found << "|" << endl;
  indent_up();

  for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
    out << indent() << desc << " id = " << (*fld_iter)->get_key() << " ifTrue: [" << endl;
    indent_up();

    out << indent() << found << " := true." << endl << indent() << val << " "
        << camelcase((*fld_iter)->get_name()) << ": " << read_val((*fld_iter)->get_type());
    indent_down();

    out << "]." << endl;
  }

  out << indent() << found << " ifNil: [iprot skip: " << desc << " type]]." << endl;
  indent_down();

  out << indent() << "oprot readStructEnd." << endl << indent() << val << "] value";
  indent_down();

  return out.str();
}